

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::UniformCase::checkUniformDefaultValues
          (UniformCase *this,
          vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  float fVar1;
  DataType DVar2;
  TestLog *pTVar3;
  pointer pVVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  pointer pBVar9;
  long local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  pBVar9 = (basicUniforms->
           super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(basicUniforms->
                          super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9) >> 3) *
      0x286bca1b < 1) {
    bVar7 = true;
  }
  else {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    bVar7 = true;
    local_1d0 = 4;
    lVar6 = 0;
    do {
      pVVar4 = (values->
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = glu::getDataTypeScalarSize(pBVar9[lVar6].type);
      local_1b0 = (undefined1  [8])pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"// Checking uniform ",0x14);
      pBVar9 = pBVar9 + lVar6;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                 (pBVar9->name)._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (pVVar4[lVar6].type != TYPE_INVALID) {
        DVar2 = pBVar9->type;
        if ((DVar2 - TYPE_FLOAT < 4) ||
           (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9)) {
          if (0 < (int)uVar5) {
            uVar8 = 0;
            do {
              fVar1 = *(float *)((long)&pVVar4->type + uVar8 * 4 + local_1d0);
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                local_1b0 = (undefined1  [8])pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// FAILURE: uniform ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                           (pBVar9->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," has non-zero initial value",0x1b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar7 = false;
              }
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if (DVar2 - TYPE_INT < 4) {
          if (0 < (int)uVar5) {
            uVar8 = 0;
            do {
              if (*(int *)((long)&pVVar4->type + uVar8 * 4 + local_1d0) != 0) {
                local_1b0 = (undefined1  [8])pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// FAILURE: uniform ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                           (pBVar9->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," has non-zero initial value",0x1b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar7 = false;
              }
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if (DVar2 - TYPE_UINT < 4) {
          if (0 < (int)uVar5) {
            uVar8 = 0;
            do {
              if (*(int *)((long)&pVVar4->type + uVar8 * 4 + local_1d0) != 0) {
                local_1b0 = (undefined1  [8])pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// FAILURE: uniform ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                           (pBVar9->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," has non-zero initial value",0x1b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar7 = false;
              }
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if (DVar2 - TYPE_BOOL < 4) {
          if (0 < (int)uVar5) {
            uVar8 = 0;
            do {
              if (*(char *)((long)&pVVar4->type + uVar8 + local_1d0) == '\x01') {
                local_1b0 = (undefined1  [8])pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// FAILURE: uniform ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                           (pBVar9->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," has non-zero initial value",0x1b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar7 = false;
              }
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if ((0xffffffe1 < DVar2 - TYPE_IMAGE_2D) && (pVVar4[lVar6].val.intV[0] != 0)) {
          local_1b0 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"// FAILURE: uniform ",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pBVar9->name)._M_dataplus._M_p,
                     (pBVar9->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," has non-zero initial value",0x1b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar7 = false;
        }
      }
      lVar6 = lVar6 + 1;
      pBVar9 = (basicUniforms->
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1d0 = local_1d0 + 0x44;
    } while (lVar6 < (int)((ulong)((long)(basicUniforms->
                                         super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9)
                          >> 3) * 0x286bca1b);
  }
  return bVar7;
}

Assistant:

bool UniformCase::checkUniformDefaultValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	DE_ASSERT(values.size() == basicUniforms.size());

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];
		const int				valSize		= glu::getDataTypeScalarSize(uniform.type);

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

#define CHECK_UNIFORM(VAR_VALUE_MEMBER, ZERO)																								\
	do																																		\
	{																																		\
		for (int i = 0; i < valSize; i++)																									\
		{																																	\
			if (unifValue.val.VAR_VALUE_MEMBER[i] != (ZERO))																				\
			{																																\
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;	\
				success = false;																											\
			}																																\
		}																																	\
	} while (false)

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			CHECK_UNIFORM(floatV, 0.0f);
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			CHECK_UNIFORM(intV, 0);
		else if (glu::isDataTypeUintOrUVec(uniform.type))
			CHECK_UNIFORM(uintV, 0);
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
			CHECK_UNIFORM(boolV, false);
		else if (glu::isDataTypeSampler(uniform.type))
		{
			if (unifValue.val.samplerV.unit != 0)
			{
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;
				success = false;
			}
		}
		else
			DE_ASSERT(false);

#undef CHECK_UNIFORM
	}

	return success;
}